

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::dht_tracker::direct_request
          (dht_tracker *this,endpoint *ep,entry *e,function<void_(const_libtorrent::dht::msg_&)> *f)

{
  sa_family_t sVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Any_data local_70;
  code *local_60;
  address local_50;
  
  p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      sVar1 = (ep->impl_).data_.base.sa_family;
      aux::listen_socket_handle::get_external_address
                (&local_50,(listen_socket_handle *)(p_Var2 + 1));
      if ((sVar1 != 2) != (local_50.type_ == ipv4)) {
        ::std::function<void_(const_libtorrent::dht::msg_&)>::function
                  ((function<void_(const_libtorrent::dht::msg_&)> *)&local_70,f);
        dht::node::direct_request
                  ((node *)&p_Var2[1]._M_left,ep,e,
                   (function<void_(const_libtorrent::dht::msg_&)> *)&local_70);
        if (local_60 == (code *)0x0) {
          return;
        }
        (*local_60)(&local_70,&local_70,__destroy_functor);
        return;
      }
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void dht_tracker::direct_request(udp::endpoint const& ep, entry& e
		, std::function<void(msg const&)> f)
	{
		for (auto& n : m_nodes)
		{
			if (ep.protocol() != (n.first.get_external_address().is_v4() ? udp::v4() : udp::v6()))
				continue;
			n.second.dht.direct_request(ep, e, f);
			break;
		}
	}